

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O1

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (long *e,undefined8 param_2)

{
  rt_expression_interface<double> *prVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  undefined8 uVar6;
  undefined8 *puVar7;
  _func_int *p_Var8;
  _func_int *p_Var9;
  
  prVar1 = (rt_expression_interface<double> *)operator_new(0x20);
  pp_Var2 = (_func_int **)(**(code **)(*e + 0x90))(e,param_2);
  pp_Var3 = (_func_int **)operator_new(8);
  *pp_Var3 = (_func_int *)&PTR__op_interface_0011e6c8;
  pp_Var4 = (_func_int **)operator_new(0x20);
  p_Var5 = (_func_int *)operator_new(0x18);
  uVar6 = (**(code **)(*e + 0x10))(e);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = &PTR__op_interface_0011e878;
  *(undefined ***)p_Var5 = &PTR__rt_unary_expr_0011e088;
  *(undefined8 *)(p_Var5 + 8) = uVar6;
  *(undefined8 **)(p_Var5 + 0x10) = puVar7;
  p_Var8 = (_func_int *)operator_new(8);
  *(undefined ***)p_Var8 = &PTR__op_interface_0011e538;
  p_Var9 = (_func_int *)operator_new(0x18);
  uVar6 = (**(code **)(*e + 0x10))(e);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = &PTR__op_interface_0011e878;
  *(undefined ***)p_Var9 = &PTR__rt_unary_expr_0011e088;
  *(undefined8 *)(p_Var9 + 8) = uVar6;
  *(undefined8 **)(p_Var9 + 0x10) = puVar7;
  *pp_Var4 = (_func_int *)&PTR__rt_binary_expr_0011e158;
  pp_Var4[1] = p_Var5;
  pp_Var4[2] = p_Var8;
  pp_Var4[3] = p_Var9;
  prVar1->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_0011e158;
  prVar1[1]._vptr_rt_expression_interface = pp_Var2;
  prVar1[2]._vptr_rt_expression_interface = pp_Var3;
  prVar1[3]._vptr_rt_expression_interface = pp_Var4;
  return prVar1;
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * e, op_tan<NumericT>, const InterfaceType * diff_var)
  {
    // 1/cos^2(e):
    return new rt_binary_expr<InterfaceType>( e->diff(diff_var),
                                              new op_binary<op_div<typename InterfaceType::numeric_type>, InterfaceType>(),
                                              new rt_binary_expr<InterfaceType>( new rt_unary_expr<InterfaceType>(e->clone(),
                                                                                                                  new op_unary<op_cos<NumericT>, InterfaceType>()),
                                                                                 new op_binary<op_mult<typename InterfaceType::numeric_type>, InterfaceType>(),
                                                                                 new rt_unary_expr<InterfaceType>(e->clone(),
                                                                                                                  new op_unary<op_cos<NumericT>, InterfaceType>()) )
                                            );
  }